

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O2

void save_state(char *path)

{
  FILE *__s;
  savestate_header_t header;
  
  header.magic[0] = 'D';
  header.magic[1] = 'G';
  header.magic[2] = 'B';
  header.cpu_size = 0x118;
  header.ppu_size = 0x3ecd4;
  header.bus_size = 0x108;
  header.mem_size = 0x48060;
  header.backup_size = mem->backup_size;
  header.apu_size = 0x4098;
  __s = fopen(path,"wb");
  fwrite(&header,0x38,1,__s);
  fwrite(cpu,header.cpu_size,1,__s);
  fwrite(ppu,header.ppu_size,1,__s);
  fwrite(bus,header.bus_size,1,__s);
  fwrite(mem,header.mem_size,1,__s);
  fwrite(mem->backup,header.backup_size,1,__s);
  fwrite(apu,header.apu_size,1,__s);
  fclose(__s);
  return;
}

Assistant:

void save_state(const char* path) {
    savestate_header_t header;
    header.magic[0] = 'D';
    header.magic[1] = 'G';
    header.magic[2] = 'B';
    header.cpu_size = sizeof(arm7tdmi_t);
    header.ppu_size = sizeof(gba_ppu_t);
    header.bus_size = sizeof(gbabus_t);
    header.mem_size = sizeof(gbamem_t);
    header.backup_size = mem->backup_size;
    header.apu_size = sizeof(gba_apu_t);

    FILE* fp = fopen(path, "wb");

    fwrite(&header, sizeof(savestate_header_t), 1, fp);
    fwrite(cpu, header.cpu_size, 1, fp);
    fwrite(ppu, header.ppu_size, 1, fp);
    fwrite(bus, header.bus_size, 1, fp);
    fwrite(mem, header.mem_size, 1, fp);
    fwrite(mem->backup, header.backup_size, 1, fp);
    fwrite(apu, header.apu_size, 1, fp);
    fclose(fp);
}